

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O3

Expression * __thiscall rsg::AssignOp::createNextChild(AssignOp *this,GeneratorState *state)

{
  ConstValueRangeAccess valueRange;
  ConstValueRangeAccess CVar1;
  ConstValueRangeAccess valueRange_00;
  ConstValueRangeAccess CVar2;
  Scalar *pSVar3;
  ExpressionSpec *pEVar4;
  Expression *pEVar5;
  Scalar *pSVar6;
  
  if (this->m_lvalueExpr == (Expression *)0x0) {
    pSVar3 = (this->m_valueRange).m_min.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar6 = (this->m_valueRange).m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pSVar3 == (this->m_valueRange).m_min.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pSVar3 = (Scalar *)0x0;
    }
    if (pSVar6 == (this->m_valueRange).m_max.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pSVar6 = (Scalar *)0x0;
    }
    valueRange.m_min = pSVar3;
    valueRange.m_type = &(this->m_valueRange).m_type;
    valueRange.m_max = pSVar6;
    pEVar4 = rsg::anon_unknown_0::chooseExpression
                       (state,(ExpressionSpec *)rsg::(anonymous_namespace)::s_lvalueSpecs,1,
                        valueRange);
    CVar1.m_min = pSVar3;
    CVar1.m_type = &(this->m_valueRange).m_type;
    CVar1.m_max = pSVar6;
    pEVar5 = (*pEVar4->create)(state,CVar1);
    this->m_lvalueExpr = pEVar5;
  }
  else if (this->m_rvalueExpr == (Expression *)0x0) {
    pSVar3 = (this->m_valueRange).m_min.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar6 = (this->m_valueRange).m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pSVar3 == (this->m_valueRange).m_min.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pSVar3 = (Scalar *)0x0;
    }
    if (pSVar6 == (this->m_valueRange).m_max.
                  super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pSVar6 = (Scalar *)0x0;
    }
    valueRange_00.m_min = pSVar3;
    valueRange_00.m_type = &(this->m_valueRange).m_type;
    valueRange_00.m_max = pSVar6;
    pEVar4 = rsg::anon_unknown_0::chooseExpression
                       (state,(ExpressionSpec *)rsg::(anonymous_namespace)::s_expressionSpecs,0x1e,
                        valueRange_00);
    CVar2.m_min = pSVar3;
    CVar2.m_type = &(this->m_valueRange).m_type;
    CVar2.m_max = pSVar6;
    pEVar5 = (*pEVar4->create)(state,CVar2);
    this->m_rvalueExpr = pEVar5;
  }
  else {
    pEVar5 = (Expression *)0x0;
  }
  return pEVar5;
}

Assistant:

Expression* AssignOp::createNextChild (GeneratorState& state)
{
	if (m_lvalueExpr == DE_NULL)
	{
		// Construct lvalue
		// \todo [2011-03-14 pyry] Proper l-value generation:
		//  - pure L-value part is generated first
		//  - variable valuerange is made unbound
		//  - R-value is generated
		//  - R-values in L-value are generated
		m_lvalueExpr = Expression::createRandomLValue(state, m_valueRange.asAccess());
		return m_lvalueExpr;
	}
	else if (m_rvalueExpr == DE_NULL)
	{
		// Construct value expr
		m_rvalueExpr = Expression::createRandom(state, m_valueRange.asAccess());
		return m_rvalueExpr;
	}
	else
		return DE_NULL;
}